

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

void stbtt_PackFontRangesPackRects(stbtt_pack_context *spc,stbrp_rect *rects,int num_rects)

{
  int num_rects_local;
  stbrp_rect *rects_local;
  stbtt_pack_context *spc_local;
  
  stbrp_pack_rects((stbrp_context *)spc->pack_info,rects,num_rects);
  return;
}

Assistant:

STBTT_DEF void stbtt_PackFontRangesPackRects(stbtt_pack_context *spc, stbrp_rect *rects, int num_rects)
{
   stbrp_pack_rects((stbrp_context *) spc->pack_info, rects, num_rects);
}